

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void copy_example_to_adf(cbify *data,example *ec)

{
  example *peVar1;
  bool bVar2;
  uint32_t uVar3;
  reference ppeVar4;
  unsigned_long **ppuVar5;
  ulong uVar6;
  long in_RDI;
  feature_index *idx;
  unsigned_long *__end3;
  unsigned_long *__begin3;
  v_array<unsigned_long> *__range3;
  features *fs;
  iterator __end2;
  iterator __begin2;
  example *__range2;
  label *lab;
  example *eca;
  size_t a;
  uint64_t mask;
  uint64_t ss;
  cbify_adf_data *adf_data;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  example *in_stack_ffffffffffffff70;
  example *in_stack_ffffffffffffff80;
  example *in_stack_ffffffffffffff88;
  features *in_stack_ffffffffffffff90;
  iterator local_68;
  iterator local_58;
  value_type local_48;
  polylabel *local_40;
  value_type local_38;
  pointer local_30;
  uint64_t local_28;
  ulong local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  
  local_18 = (vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x60);
  uVar3 = parameters::stride_shift
                    ((parameters *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  local_20 = (ulong)uVar3;
  local_28 = parameters::mask((parameters *)
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  for (local_30 = (pointer)0x0;
      local_30 <
      local_18[1].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start; local_30 = (pointer)((long)local_30 + 1)) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_18,(size_type)local_30);
    local_38 = *ppeVar4;
    local_40 = &local_38->l;
    (*(code *)CB::cb_label)(local_40);
    VW::copy_example_data
              (SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0),in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    local_48 = local_38;
    local_58 = example_predict::begin(&in_stack_ffffffffffffff70->super_example_predict);
    local_68 = example_predict::end(&in_stack_ffffffffffffff70->super_example_predict);
    while (bVar2 = example_predict::iterator::operator!=(&local_58,&local_68), bVar2) {
      in_stack_ffffffffffffff90 = example_predict::iterator::operator*(&local_58);
      in_stack_ffffffffffffff88 = (example *)&in_stack_ffffffffffffff90->indicies;
      ppuVar5 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff80 = (example *)*ppuVar5;
      ppuVar5 = v_array<unsigned_long>::end((v_array<unsigned_long> *)in_stack_ffffffffffffff88);
      peVar1 = (example *)*ppuVar5;
      for (; in_stack_ffffffffffffff80 != peVar1;
          in_stack_ffffffffffffff80 =
               (example *)&(in_stack_ffffffffffffff80->super_example_predict).indices._end) {
        (in_stack_ffffffffffffff80->super_example_predict).indices._begin =
             (uchar *)(((ulong)(in_stack_ffffffffffffff80->super_example_predict).indices._begin >>
                       ((byte)local_20 & 0x3f)) * 0x1b90d09 + (long)local_30 * 0x49be95 <<
                       ((byte)local_20 & 0x3f) & local_28);
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff80;
      }
      example_predict::iterator::operator++(&local_58);
    }
    bVar2 = CB_ALGS::example_is_newline_not_header(in_stack_ffffffffffffff70);
    if ((bVar2) && (uVar6 = (*(code *)PTR_test_label_0048cd20)(&local_38->l), (uVar6 & 1) != 0)) {
      v_array<char>::push_back
                ((v_array<char> *)in_stack_ffffffffffffff70,
                 (char *)CONCAT17(0x6e,in_stack_ffffffffffffff68));
    }
  }
  return;
}

Assistant:

void copy_example_to_adf(cbify& data, example& ec)
{
  auto& adf_data = data.adf_data;
  const uint64_t ss = data.all->weights.stride_shift();
  const uint64_t mask = data.all->weights.mask();

  for (size_t a = 0; a < adf_data.num_actions; ++a)
  {
    auto& eca = *adf_data.ecs[a];
    // clear label
    auto& lab = eca.l.cb;
    CB::cb_label.default_label(&lab);

    // copy data
    VW::copy_example_data(false, &eca, &ec);

    // offset indicies for given action
    for (features& fs : eca)
    {
      for (feature_index& idx : fs.indicies)
      {
        idx = ((((idx >> ss) * 28904713) + 4832917 * (uint64_t)a) << ss) & mask;
      }
    }

    // avoid empty example by adding a tag (hacky)
    if (CB_ALGS::example_is_newline_not_header(eca) && CB::cb_label.test_label(&eca.l))
    {
      eca.tag.push_back('n');
    }
  }
}